

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_states.hpp
# Opt level: O1

void __thiscall duckdb::MultiFileLocalState::~MultiFileLocalState(MultiFileLocalState *this)

{
  _Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  *(undefined ***)this = &PTR__MultiFileLocalState_004a46a8;
  std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
             *)&this->field_0xa8);
  if (*(void **)&this->executor != (void *)0x0) {
    operator_delete(*(void **)&this->executor);
  }
  duckdb::DataChunk::~DataChunk(&this->scan_chunk);
  _Var1._M_head_impl =
       (this->local_state).
       super_unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LocalTableFunctionState_*,_std::default_delete<duckdb::LocalTableFunctionState>_>
       .super__Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (LocalTableFunctionState *)0x0) {
    (**(code **)(*(long *)_Var1._M_head_impl + 8))();
  }
  (this->local_state).
  super_unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalTableFunctionState_*,_std::default_delete<duckdb::LocalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::LocalTableFunctionState_*,_false>._M_head_impl =
       (LocalTableFunctionState *)0x0;
  this_00 = (this->reader).internal.
            super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  duckdb::LocalTableFunctionState::~LocalTableFunctionState(&this->super_LocalTableFunctionState);
  operator_delete(this);
  return;
}

Assistant:

explicit MultiFileLocalState(ClientContext &context) : executor(context) {
	}